

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_new_tensor_impl
          (ggml_context *ctx,ggml_type type,int n_dims,int64_t *ne,ggml_tensor *view_src,
          size_t view_offs)

{
  size_t sVar1;
  ggml_object *pgVar2;
  ggml_tensor *__dest;
  int64_t iVar3;
  long in_RCX;
  int in_EDX;
  ggml_type in_ESI;
  long in_RDI;
  long in_R8;
  long in_R9;
  int i_2;
  int i_1;
  ggml_tensor *result;
  ggml_object *obj_new;
  size_t obj_alloc_size;
  void *data;
  int i;
  size_t data_size;
  int64_t in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  int64_t iVar4;
  ggml_tensor *in_stack_fffffffffffffe38;
  int local_1b0;
  int local_1ac;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  size_t in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  ggml_object_type type_00;
  ggml_context *in_stack_fffffffffffffe98;
  int local_34;
  size_t local_30;
  long local_28;
  long local_20;
  
  type_00 = (ggml_object_type)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  if (0x26 < in_ESI) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x629
               ,"GGML_ASSERT(%s) failed","type >= 0 && type < GGML_TYPE_COUNT");
  }
  if ((0 < in_EDX) && (in_EDX < 5)) {
    local_28 = in_R9;
    local_20 = in_R8;
    if ((in_R8 != 0) && (*(long *)(in_R8 + 0xe8) != 0)) {
      local_28 = *(long *)(in_R8 + 0xf0) + in_R9;
      local_20 = *(long *)(in_R8 + 0xe8);
    }
    local_30 = ggml_row_size((ggml_type)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                             in_stack_fffffffffffffe18);
    for (local_34 = 1; local_34 < in_EDX; local_34 = local_34 + 1) {
      local_30 = *(long *)(in_RCX + (long)local_34 * 8) * local_30;
    }
    if (((local_20 != 0) && (local_30 != 0)) &&
       (sVar1 = ggml_nbytes(in_stack_fffffffffffffe38), sVar1 < local_30 + local_28)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x637,"GGML_ASSERT(%s) failed",
                 "view_src == NULL || data_size == 0 || data_size + view_offs <= ggml_nbytes(view_src)"
                );
    }
    pgVar2 = ggml_new_object(in_stack_fffffffffffffe98,type_00,in_stack_fffffffffffffe88);
    if (pgVar2 != (ggml_object *)0x0) {
      __dest = (ggml_tensor *)(*(long *)(in_RDI + 8) + pgVar2->offs);
      memset(local_1a8,0,0x150);
      local_198 = 1;
      local_190 = 1;
      local_188 = 1;
      local_180 = 1;
      memcpy(__dest,local_1a8,0x150);
      for (local_1ac = 0; local_1ac < in_EDX; local_1ac = local_1ac + 1) {
        __dest->ne[local_1ac] = *(int64_t *)(in_RCX + (long)local_1ac * 8);
      }
      sVar1 = ggml_type_size(in_ESI);
      __dest->nb[0] = sVar1;
      sVar1 = __dest->nb[0];
      iVar4 = __dest->ne[0];
      iVar3 = ggml_blck_size(in_ESI);
      __dest->nb[1] = sVar1 * (iVar4 / iVar3);
      for (local_1b0 = 2; local_1b0 < 4; local_1b0 = local_1b0 + 1) {
        __dest->nb[local_1b0] = __dest->nb[local_1b0 + -1] * __dest->ne[local_1b0 + -1];
      }
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
      return __dest;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x646
               ,"GGML_ASSERT(%s) failed","obj_new");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x62a,
             "GGML_ASSERT(%s) failed","n_dims >= 1 && n_dims <= GGML_MAX_DIMS");
}

Assistant:

static struct ggml_tensor * ggml_new_tensor_impl(
        struct ggml_context * ctx,
        enum   ggml_type      type,
        int                   n_dims,
        const int64_t       * ne,
        struct ggml_tensor  * view_src,
        size_t                view_offs) {

    GGML_ASSERT(type >= 0 && type < GGML_TYPE_COUNT);
    GGML_ASSERT(n_dims >= 1 && n_dims <= GGML_MAX_DIMS);

    // find the base tensor and absolute offset
    if (view_src != NULL && view_src->view_src != NULL) {
        view_offs += view_src->view_offs;
        view_src   = view_src->view_src;
    }

    size_t data_size = ggml_row_size(type, ne[0]);
    for (int i = 1; i < n_dims; i++) {
        data_size *= ne[i];
    }

    GGML_ASSERT(view_src == NULL || data_size == 0 || data_size + view_offs <= ggml_nbytes(view_src));

    void * data = view_src != NULL ? view_src->data : NULL;
    if (data != NULL) {
        data = (char *) data + view_offs;
    }

    size_t obj_alloc_size = 0;

    if (view_src == NULL && !ctx->no_alloc) {
        // allocate tensor data in the context's memory pool
        obj_alloc_size = data_size;
    }

    struct ggml_object * const obj_new = ggml_new_object(ctx, GGML_OBJECT_TYPE_TENSOR, GGML_TENSOR_SIZE + obj_alloc_size);
    GGML_ASSERT(obj_new);

    struct ggml_tensor * const result = (struct ggml_tensor *)((char *)ctx->mem_buffer + obj_new->offs);

    *result = (struct ggml_tensor) {
        /*.type         =*/ type,
        /*.buffer       =*/ NULL,
        /*.ne           =*/ { 1, 1, 1, 1 },
        /*.nb           =*/ { 0, 0, 0, 0 },
        /*.op           =*/ GGML_OP_NONE,
        /*.op_params    =*/ { 0 },
        /*.flags        =*/ 0,
        /*.src          =*/ { NULL },
        /*.view_src     =*/ view_src,
        /*.view_offs    =*/ view_offs,
        /*.data         =*/ obj_alloc_size > 0 ? (void *)(result + 1) : data,
        /*.name         =*/ { 0 },
        /*.extra        =*/ NULL,
        /*.padding      =*/ { 0 },
    };

    // TODO: this should not be needed as long as we don't rely on aligned SIMD loads
    //GGML_ASSERT_ALIGNED(result->data);

    for (int i = 0; i < n_dims; i++) {
        result->ne[i] = ne[i];
    }

    result->nb[0] = ggml_type_size(type);
    result->nb[1] = result->nb[0]*(result->ne[0]/ggml_blck_size(type));
    for (int i = 2; i < GGML_MAX_DIMS; i++) {
        result->nb[i] = result->nb[i - 1]*result->ne[i - 1];
    }

    ctx->n_objects++;

    return result;
}